

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_api.cc
# Opt level: O1

string * __thiscall
re2c::InputAPI::stmt_backup_abi_cxx11_(string *__return_storage_ptr__,InputAPI *this,uint32_t ind)

{
  pointer pcVar1;
  opt_t *poVar2;
  long *plVar3;
  long *plVar4;
  size_type *psVar5;
  int iVar6;
  long lVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string s;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  undefined8 local_68;
  undefined1 local_60;
  undefined7 uStack_5f;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  local_48 = 0;
  local_40 = 0;
  local_50 = &local_40;
  if (this->type_ == CUSTOM) {
    poVar2 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
    pcVar1 = (poVar2->yybackup)._M_dataplus._M_p;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,pcVar1,pcVar1 + (poVar2->yybackup)._M_string_length);
    std::__cxx11::string::append((char *)&local_90);
    std::__cxx11::string::operator=((string *)&local_50,(string *)&local_90);
    lVar7 = local_80;
    plVar3 = local_90;
    if (local_90 == &local_80) goto LAB_00120d8e;
  }
  else {
    if (this->type_ != DEFAULT) goto LAB_00120d8e;
    poVar2 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
    pcVar1 = (poVar2->yymarker)._M_dataplus._M_p;
    local_70 = (long *)&local_60;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar1,pcVar1 + (poVar2->yymarker)._M_string_length);
    std::__cxx11::string::append((char *)&local_70);
    poVar2 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
    plVar3 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_70,(ulong)(poVar2->yycursor)._M_dataplus._M_p);
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_80 = *plVar4;
      lStack_78 = plVar3[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *plVar4;
      local_90 = (long *)*plVar3;
    }
    local_88 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_50,(string *)&local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_70 == (long *)&local_60) goto LAB_00120d8e;
    lVar7 = CONCAT71(uStack_5f,local_60);
    plVar3 = local_70;
  }
  operator_delete(plVar3,lVar7 + 1);
LAB_00120d8e:
  local_68 = 0;
  local_60 = 0;
  iVar6 = ind + 1;
  local_70 = (long *)&local_60;
  while ((poVar2 = realopt_t::operator->((realopt_t *)&DAT_0015d868), poVar2->target != DOT &&
         (iVar6 = iVar6 + -1, iVar6 != 0))) {
    poVar2 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
    std::__cxx11::string::_M_append((char *)&local_70,(ulong)(poVar2->indString)._M_dataplus._M_p);
  }
  plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_50);
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_80 = *plVar4;
    lStack_78 = plVar3[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar4;
    local_90 = (long *)*plVar3;
  }
  local_88 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_90);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar5 = (size_type *)(plVar3 + 2);
  if ((size_type *)*plVar3 == psVar5) {
    lVar7 = plVar3[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar7;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
  }
  __return_storage_ptr__->_M_string_length = plVar3[1];
  *plVar3 = (long)psVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if (local_70 != (long *)&local_60) {
    operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
  }
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string InputAPI::stmt_backup (uint32_t ind) const
{
	std::string s;
	switch (type_)
	{
		case DEFAULT:
			s = opts->yymarker + " = " + opts->yycursor;
			break;
		case CUSTOM:
			s = opts->yybackup + " ()";
			break;
	}
	return indent (ind) + s + ";\n";
}